

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

InsertOrderedSet<CFG::Block_*> * __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::operator[]
          (InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this,Block **k)

{
  pointer ppVar1;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
  pVar2;
  _List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_> local_e8;
  undefined1 local_e0;
  InsertOrderedSet<CFG::Block_*> local_c8;
  undefined1 local_70 [8];
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> kv;
  Block **k_local;
  InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this_local;
  
  local_c8.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_c8.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  _M_size = 0;
  local_c8.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c8.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)0x0;
  local_c8.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c8.Map._M_h._M_rehash_policy._4_4_ = 0;
  local_c8.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8.Map._M_h._M_element_count = 0;
  local_c8.Map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c8.Map._M_h._M_bucket_count = 0;
  kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  _M_size = (size_t)k;
  InsertOrderedSet<CFG::Block_*>::InsertOrderedSet(&local_c8);
  std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>::
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>,_true>
            ((pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_70,k,&local_c8)
  ;
  InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet(&local_c8);
  pVar2 = insert(this,(pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_70);
  local_e8 = pVar2.first._M_node;
  local_e0 = pVar2.second;
  ppVar1 = std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>
           ::operator->(&local_e8);
  std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>::~pair
            ((pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_70);
  return &ppVar1->second;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }